

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpthreaddelegate.cpp
# Opt level: O0

void __thiscall
QHttpThreadDelegate::synchronousFinishedWithErrorSlot
          (QHttpThreadDelegate *this,NetworkError errorCode,QString *detail)

{
  long lVar1;
  QHttpNetworkReply *in_RDX;
  undefined4 in_ESI;
  QObject *in_RDI;
  long in_FS_OFFSET;
  QByteArray *in_stack_ffffffffffffffb8;
  ConnectionType c;
  undefined4 in_stack_ffffffffffffffd0;
  QObject *obj;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (*(long *)(in_RDI + 0x150) != 0) {
    *(undefined4 *)(in_RDI + 0xf0) = in_ESI;
    obj = in_RDI;
    QString::operator=((QString *)(in_RDI + 0xf8),(QString *)in_RDX);
    QHttpNetworkReply::readAll(in_RDX);
    c = (ConnectionType)((ulong)in_RDX >> 0x20);
    QByteArray::operator=((QByteArray *)in_RDI,in_stack_ffffffffffffffb8);
    QByteArray::~QByteArray((QByteArray *)0x30eff3);
    QMetaObject::invokeMethod<>(obj,(char *)CONCAT44(in_ESI,in_stack_ffffffffffffffd0),c);
    QMetaObject::invokeMethod<>(obj,(char *)CONCAT44(in_ESI,in_stack_ffffffffffffffd0),c);
    *(undefined8 *)(in_RDI + 0x150) = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QHttpThreadDelegate::synchronousFinishedWithErrorSlot(QNetworkReply::NetworkError errorCode, const QString &detail)
{
    if (!httpReply)
        return;

#ifdef QHTTPTHREADDELEGATE_DEBUG
    qDebug() << "QHttpThreadDelegate::synchronousFinishedWithErrorSlot() thread=" << QThread::currentThreadId() << "error=" << errorCode << detail;
#endif
    incomingErrorCode = errorCode;
    incomingErrorDetail = detail;

    synchronousDownloadData = httpReply->readAll();

    QMetaObject::invokeMethod(httpReply, "deleteLater", Qt::QueuedConnection);
    QMetaObject::invokeMethod(synchronousRequestLoop, "quit", Qt::QueuedConnection);
    httpReply = nullptr;
}